

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

bool __thiscall QHostAddressPrivate::parse(QHostAddressPrivate *this,QString *ipString)

{
  bool bVar1;
  const_iterator pQVar2;
  const_iterator pQVar3;
  ulong uVar4;
  IPv6Address *in_RSI;
  QHostAddressPrivate *in_RDI;
  long in_FS_OFFSET;
  quint32 maybeIp4;
  QString a;
  quint8 maybeIp6 [16];
  undefined4 in_stack_ffffffffffffff88;
  CaseSensitivity in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  quint8 *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QHostAddressPrivate *address;
  bool local_39;
  uint local_38;
  QChar local_32;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->protocol = -1;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  address = in_RDI;
  QString::simplified((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = QString::isEmpty((QString *)0x21601b);
  if (bVar1) {
    local_39 = false;
  }
  else {
    QChar::QChar<char16_t,_true>(&local_32,L':');
    bVar1 = QString::contains((QString *)
                              CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                              (QChar)(char16_t)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                              in_stack_ffffffffffffff8c);
    if (bVar1) {
      local_18 = 0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      bVar1 = parseIp6((QString *)address,in_RSI,
                       (QString *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      if (bVar1) {
        setAddress(in_RDI,in_stack_ffffffffffffff98);
        local_39 = true;
        goto LAB_00216115;
      }
    }
    local_38 = 0;
    pQVar2 = QString::constBegin((QString *)0x2160c4);
    pQVar3 = QString::constEnd((QString *)
                               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    uVar4 = QIPAddressUtils::parseIp4(&local_38,pQVar2,pQVar3);
    if ((uVar4 & 1) == 0) {
      local_39 = false;
    }
    else {
      setAddress((QHostAddressPrivate *)
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff8c);
      local_39 = true;
    }
  }
LAB_00216115:
  QString::~QString((QString *)0x21611f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_39;
}

Assistant:

bool QHostAddressPrivate::parse(const QString &ipString)
{
    protocol = QHostAddress::UnknownNetworkLayerProtocol;
    QString a = ipString.simplified();
    if (a.isEmpty())
        return false;

    // All IPv6 addresses contain a ':', and may contain a '.'.
    if (a.contains(u':')) {
        quint8 maybeIp6[16];
        if (parseIp6(a, maybeIp6, &scopeId)) {
            setAddress(maybeIp6);
            return true;
        }
    }

    quint32 maybeIp4 = 0;
    if (QIPAddressUtils::parseIp4(maybeIp4, a.constBegin(), a.constEnd())) {
        setAddress(maybeIp4);
        return true;
    }

    return false;
}